

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clEnqueueSVMMigrateMem
                 (cl_command_queue command_queue,cl_uint num_svm_pointers,void **svm_pointers,
                 size_t *sizes,cl_mem_migration_flags flags,cl_uint num_events_in_wait_list,
                 cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  cl_int errorCode;
  int iVar3;
  cl_int errorCode_00;
  uint64_t enqueueCounter;
  time_point tVar4;
  time_point tVar5;
  time_point local_98;
  string eventWaitListString;
  string local_70;
  time_point local_50;
  time_point local_48;
  undefined8 local_40;
  cl_event local_event;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  if ((g_pIntercept->m_Dispatch).clEnqueueSVMMigrateMem == (cl_api_clEnqueueSVMMigrateMem)0x0) {
    return -0x24;
  }
  enqueueCounter = CLIntercept::incrementEnqueueCounter(g_pIntercept);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueSVMMigrateMem",enqueueCounter,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,command_queue);
  }
  errorCode = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00132a97;
  getFormattedEventWaitList_abi_cxx11_
            (&eventWaitListString,this,num_events_in_wait_list,event_wait_list);
  if ((this->m_Config).CallLogging == true) {
    CEnumNameMap::name_mem_migration_flags_abi_cxx11_(&local_70,&this->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clEnqueueSVMMigrateMem",enqueueCounter,(cl_kernel)0x0,
               "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",command_queue,
               num_svm_pointers,local_70._M_dataplus._M_p,flags,eventWaitListString._M_dataplus._M_p
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueSVMMigrateMem",num_events_in_wait_list,event_wait_list,event);
  }
  local_event = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_48.__d.__r = (duration)0;
    local_40 = 0;
  }
  else {
    local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_40 = CONCAT71((int7)((ulong)local_48.__d.__r >> 8),event == (cl_event *)0x0);
    if (event == (cl_event *)0x0) {
      event = &local_event;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_50.__d.__r = (duration)0;
  }
  else {
    local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*(this->m_Dispatch).clEnqueueSVMMigrateMem)
                        (command_queue,num_svm_pointers,svm_pointers,sizes,flags,
                         num_events_in_wait_list,event_wait_list,event);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_98.__d.__r = (duration)0;
  }
  else {
    local_98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      CLIntercept::updateHostTimingStats(this,"clEnqueueSVMMigrateMem",&local_70,local_50,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00132873:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"clEnqueueSVMMigrateMem","");
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (iVar3 == 0) goto LAB_0013293e;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        CLIntercept::addTimingEvent
                  (this,"clEnqueueSVMMigrateMem",enqueueCounter,local_48,&local_70,command_queue,
                   *event);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
LAB_0013293e:
      if ((char)local_40 != '\0') {
        (*(this->m_Dispatch).clReleaseEvent)(*event);
        goto LAB_0013294f;
      }
    }
  }
  else {
    if (event != (cl_event *)0x0) goto LAB_00132873;
LAB_0013294f:
    event = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_001329b6;
    }
    else if (errorCode == 0) goto LAB_00132988;
LAB_0013299b:
    if ((bVar2 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode = 0;
    }
  }
  else {
    if (errorCode != 0) {
      CLIntercept::logError(this,"clEnqueueSVMMigrateMem",errorCode);
      bVar2 = (this->m_Config).ErrorAssert;
      goto LAB_0013299b;
    }
LAB_00132988:
    errorCode = 0;
  }
LAB_001329b6:
  if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event != (cl_event)0x0)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Events;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueSVMMigrateMem",errorCode,event,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueSVMMigrateMem",&local_70,true,enqueueCounter,local_50,local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event,enqueueCounter);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)eventWaitListString._M_dataplus._M_p != &eventWaitListString.field_2) {
    operator_delete(eventWaitListString._M_dataplus._M_p);
  }
LAB_00132a97:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if ((this->m_Config).ToolOverheadTiming == true) {
      if (((this->m_Config).HostPerformanceTiming == false) &&
         ((this->m_Config).ChromeCallLogging != true)) {
        tVar4.__d.__r = (duration)0;
      }
      else {
        tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
    }
    else {
      tVar4.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueSVMMigrateMem");
    errorCode_00 = (*(this->m_Dispatch).clFinish)(command_queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueSVMMigrateMem",errorCode_00);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        eventWaitListString._M_dataplus._M_p = (pointer)&eventWaitListString.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&eventWaitListString,"");
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",&eventWaitListString,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)eventWaitListString._M_dataplus._M_p != &eventWaitListString.field_2) {
          operator_delete(eventWaitListString._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        eventWaitListString._M_dataplus._M_p = (pointer)&eventWaitListString.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&eventWaitListString,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&eventWaitListString,false,0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)eventWaitListString._M_dataplus._M_p != &eventWaitListString.field_2) {
          operator_delete(eventWaitListString._M_dataplus._M_p);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar4.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar4.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar5.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        eventWaitListString._M_dataplus._M_p = (pointer)&eventWaitListString.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&eventWaitListString,"");
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",&eventWaitListString,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)eventWaitListString._M_dataplus._M_p != &eventWaitListString.field_2) {
          operator_delete(eventWaitListString._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        eventWaitListString._M_dataplus._M_p = (pointer)&eventWaitListString.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&eventWaitListString,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&eventWaitListString,false,0,tVar4,tVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)eventWaitListString._M_dataplus._M_p != &eventWaitListString.field_2) {
          operator_delete(eventWaitListString._M_dataplus._M_p);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(command_queue);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueSVMMigrateMem(
    cl_command_queue command_queue,
    cl_uint num_svm_pointers,
    const void** svm_pointers,
    const size_t* sizes,
    cl_mem_migration_flags flags,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueSVMMigrateMem )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, num_svm_pointers = %u, flags = %s (%llX)%s",
                command_queue,
                num_svm_pointers,
                pIntercept->enumName().name_mem_migration_flags( flags ).c_str(),
                flags,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueSVMMigrateMem(
                command_queue,
                num_svm_pointers,
                svm_pointers,
                sizes,
                flags,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END();
            DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}